

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_formatter
          (ansicolor_sink<spdlog::details::console_mutex> *this,
          unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *sink_formatter)

{
  lock_guard<std::mutex> *in_RSI;
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  
  std::lock_guard<std::mutex>::lock_guard(in_RSI,in_RDI);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator=
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)in_RSI,
             (unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)in_RDI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x22f44c);
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_formatter(std::unique_ptr<spdlog::formatter> sink_formatter)
{
    std::lock_guard<mutex_t> lock(mutex_);
    formatter_ = std::move(sink_formatter);
}